

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading-c.cpp
# Opt level: O3

void duckdb_finish_execution(duckdb_task_state state_p)

{
  type paVar1;
  TaskScheduler *this;
  
  if (state_p != (duckdb_task_state)0x0) {
    paVar1 = duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>::
             operator*((unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>
                        *)((long)state_p + 8));
    LOCK();
    (paVar1->_M_base)._M_i = false;
    UNLOCK();
    if (*(long *)((long)state_p + 0x10) != 0) {
      this = duckdb::TaskScheduler::GetScheduler(*state_p);
      duckdb::TaskScheduler::Signal(this,*(idx_t *)((long)state_p + 0x10));
      return;
    }
  }
  return;
}

Assistant:

void duckdb_finish_execution(duckdb_task_state state_p) {
	if (!state_p) {
		return;
	}
	auto state = (CAPITaskState *)state_p;
	*state->marker = false;
	if (state->execute_count > 0) {
		// signal to the threads to wake up
		auto &scheduler = duckdb::TaskScheduler::GetScheduler(state->db);
		scheduler.Signal(state->execute_count);
	}
}